

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QVariant * __thiscall QFileSystemModel::data(QFileSystemModel *this,QModelIndex *index,int role)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Int IVar4;
  Int IVar5;
  QFileSystemModelPrivate *this_00;
  QFileSystemModelPrivate *pQVar6;
  pointer this_01;
  QFileSystemNode *this_02;
  int in_ECX;
  QModelIndex *in_RDX;
  undefined8 uVar7;
  QFileSystemModelPrivate *in_RSI;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  int p;
  QAbstractFileIconProvider *provider;
  QFileSystemModelPrivate *d;
  QIcon icon;
  QFileSystemNode *in_stack_fffffffffffffea8;
  QModelIndex *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  QFileSystemModelPrivate *this_03;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  QModelIndex *in_stack_fffffffffffffee0;
  QFlagsStorageHelper<QFileDevice::Permission,_4> local_f0;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_ec;
  undefined1 local_e8 [8];
  undefined1 *local_e0;
  QFileInfo local_d8 [8];
  undefined1 local_d0 [24];
  undefined1 local_b8 [24];
  char local_a0 [32];
  undefined1 local_80 [48];
  undefined1 local_50 [24];
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = in_RDI;
  this_00 = d_func((QFileSystemModel *)0xaa50eb);
  bVar1 = QModelIndex::isValid(in_stack_fffffffffffffeb0);
  if ((!bVar1) ||
     (pQVar6 = (QFileSystemModelPrivate *)QModelIndex::model((QModelIndex *)0xaa510a),
     pQVar6 != in_RSI)) {
    ::QVariant::QVariant((QVariant *)0xaa511e);
    goto LAB_00aa5557;
  }
  if (in_ECX == 0) {
LAB_00aa51f1:
    uVar2 = QModelIndex::column(in_RDX);
    switch((QModelIndex *)(ulong)uVar2) {
    case (QModelIndex *)0x0:
      QFileSystemModelPrivate::displayName
                ((QFileSystemModelPrivate *)CONCAT44(in_ECX,in_stack_fffffffffffffeb8),
                 (QModelIndex *)(ulong)uVar2);
      ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_38);
      QString::~QString((QString *)0xaa5257);
      break;
    case (QModelIndex *)0x1:
      QFileSystemModelPrivate::size
                ((QFileSystemModelPrivate *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(QModelIndex *)in_RSI
                );
      ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_50);
      QString::~QString((QString *)0xaa5292);
      break;
    case (QModelIndex *)0x2:
      QFileSystemModelPrivate::type(this_03,(QModelIndex *)in_RDI);
      ::QVariant::QVariant((QVariant *)in_RDI,(QString *)(local_80 + 0x18));
      QString::~QString((QString *)0xaa52cd);
      break;
    case (QModelIndex *)0x3:
      QFileSystemModelPrivate::time((QFileSystemModelPrivate *)local_80,(time_t *)this_00);
      ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_80);
      QString::~QString((QString *)0xaa5308);
      break;
    default:
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)CONCAT44(in_ECX,in_stack_fffffffffffffeb8),0,
                 (char *)in_stack_fffffffffffffea8);
      uVar2 = QModelIndex::column(in_RDX);
      QMessageLogger::warning(local_a0,"data: invalid display value column %d",(ulong)uVar2);
      goto LAB_00aa554d;
    }
  }
  else {
    if (in_ECX == 1) {
      iVar3 = QModelIndex::column(in_RDX);
      if (iVar3 == 0) {
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        QFileSystemModelPrivate::icon(this_03,(QModelIndex *)in_RDI);
        bVar1 = QIcon::isNull((QIcon *)in_stack_fffffffffffffeb0);
        if (bVar1) {
          this_01 = std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::
                    operator->((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                                *)0xaa5452);
          this_02 = (QFileSystemNode *)QFileInfoGatherer::iconProvider((QFileInfoGatherer *)this_01)
          ;
          if (this_02 != (QFileSystemNode *)0x0) {
            QFileSystemModelPrivate::node
                      ((QFileSystemModelPrivate *)CONCAT44(in_ECX,in_stack_fffffffffffffeb8),
                       in_stack_fffffffffffffeb0);
            bVar1 = QFileSystemModelPrivate::QFileSystemNode::isDir(this_02);
            uVar7 = 6;
            if (bVar1) {
              uVar7 = 5;
            }
            (**(code **)&(this_02->fileName).d.d[1].super_QArrayData)(local_e8,this_02,uVar7);
            QIcon::operator=((QIcon *)in_RDI,(QIcon *)CONCAT44(in_ECX,in_stack_fffffffffffffeb8));
            QIcon::~QIcon((QIcon *)in_stack_fffffffffffffeb0);
            in_stack_fffffffffffffea8 = this_02;
          }
        }
        QIcon::operator_cast_to_QVariant((QIcon *)in_stack_fffffffffffffea8);
        QIcon::~QIcon((QIcon *)in_stack_fffffffffffffeb0);
        goto LAB_00aa5557;
      }
    }
    else {
      if (in_ECX == 2) {
        iVar3 = QModelIndex::column(in_RDX);
        if (iVar3 == 0) {
          QFileSystemModelPrivate::name(in_RSI,(QModelIndex *)this_03);
          ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_20);
          QString::~QString((QString *)0xaa51ea);
          goto LAB_00aa5557;
        }
        goto LAB_00aa51f1;
      }
      if (in_ECX == 7) {
        iVar3 = QModelIndex::column(in_RDX);
        if (iVar3 == 1) {
          local_ec.super_QFlagsStorage<Qt::AlignmentFlag>.i =
               (QFlagsStorage<Qt::AlignmentFlag>)
               Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                             (enum_type)in_stack_fffffffffffffeb0);
          IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ec);
          ::QVariant::QVariant((QVariant *)in_RDI,IVar4);
          goto LAB_00aa5557;
        }
      }
      else {
        if (in_ECX == 0xfc) {
          fileInfo((QFileSystemModel *)this_03,(QModelIndex *)in_RDI);
          ::QVariant::fromValue<QFileInfo,_true>
                    ((QFileInfo *)CONCAT44(in_ECX,in_stack_fffffffffffffeb8));
          QFileInfo::~QFileInfo(local_d8);
          goto LAB_00aa5557;
        }
        if (in_ECX == 0x101) {
          filePath((QFileSystemModel *)this_00,in_stack_fffffffffffffee0);
          ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_b8);
          QString::~QString((QString *)0xaa5380);
          goto LAB_00aa5557;
        }
        if (in_ECX == 0x102) {
          QFileSystemModelPrivate::name(in_RSI,(QModelIndex *)this_03);
          ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_d0);
          QString::~QString((QString *)0xaa53bb);
          goto LAB_00aa5557;
        }
        if (in_ECX == 0x103) {
          local_f0.super_QFlagsStorage<QFileDevice::Permission>.i =
               (QFlagsStorage<QFileDevice::Permission>)
               permissions((QFileSystemModel *)CONCAT44(0x103,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb0);
          IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_f0);
          ::QVariant::QVariant((QVariant *)in_RDI,IVar5);
          goto LAB_00aa5557;
        }
      }
    }
LAB_00aa554d:
    ::QVariant::QVariant((QVariant *)0xaa5557);
  }
LAB_00aa5557:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)this_03;
}

Assistant:

QVariant QFileSystemModel::data(const QModelIndex &index, int role) const
{
    Q_D(const QFileSystemModel);
    if (!index.isValid() || index.model() != this)
        return QVariant();

    switch (role) {
    case Qt::EditRole:
        if (index.column() == QFileSystemModelPrivate::NameColumn)
            return d->name(index);
        Q_FALLTHROUGH();
    case Qt::DisplayRole:
        switch (index.column()) {
        case QFileSystemModelPrivate::NameColumn: return d->displayName(index);
        case QFileSystemModelPrivate::SizeColumn: return d->size(index);
        case QFileSystemModelPrivate::TypeColumn: return d->type(index);
        case QFileSystemModelPrivate::TimeColumn: return d->time(index);
        default:
            qWarning("data: invalid display value column %d", index.column());
            break;
        }
        break;
    case FilePathRole:
        return filePath(index);
    case FileNameRole:
        return d->name(index);
    case FileInfoRole:
        return QVariant::fromValue(fileInfo(index));
    case Qt::DecorationRole:
        if (index.column() == QFileSystemModelPrivate::NameColumn) {
            QIcon icon = d->icon(index);
#if QT_CONFIG(filesystemwatcher)
            if (icon.isNull()) {
                using P = QAbstractFileIconProvider;
                if (auto *provider = d->fileInfoGatherer->iconProvider())
                    icon = provider->icon(d->node(index)->isDir() ? P::Folder: P::File);
            }
#endif // filesystemwatcher
            return icon;
        }
        break;
    case Qt::TextAlignmentRole:
        if (index.column() == QFileSystemModelPrivate::SizeColumn)
            return QVariant(Qt::AlignTrailing | Qt::AlignVCenter);
        break;
    case FilePermissions:
        int p = permissions(index);
        return p;
    }

    return QVariant();
}